

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int sort_5_4::merge_sort_1(int *a,int low,int high)

{
  undefined4 *puVar1;
  
  merge_sort_1(a,low,(high + low) / 2);
  ps_int((int *)&DAT_00104190,10);
  merge_sort_1((int *)&DAT_00104190,0,9);
  puVar1 = &graph_5_4::visited;
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while( true );
}

Assistant:

int merge_sort_1(int *a, int low, int high) {
        if (low < high) {
            int mid = (low + high) / 2;
            merge_sort_1(a, low, mid);
            merge_sort_1(a, mid + 1, high);
            merge_1(a, mid, low, high);
        }
    }